

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

void google::protobuf::compiler::ruby::GenerateEnum(EnumDescriptor *en,Printer *printer)

{
  string *value1;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  long lVar2;
  long lVar3;
  string local_50;
  
  io::Printer::Print(printer,"add_enum \"$name$\" do\n","name",*(string **)(en + 8));
  io::Printer::Indent(printer);
  lVar3 = 0x10;
  uVar1 = extraout_RDX;
  for (lVar2 = 0; lVar2 < *(int *)(en + 0x2c); lVar2 = lVar2 + 1) {
    value1 = *(string **)(*(long *)(en + 0x30) + -0x10 + lVar3);
    IntToString_abi_cxx11_
              (&local_50,(ruby *)(ulong)*(uint *)(*(long *)(en + 0x30) + lVar3),(int32)uVar1);
    io::Printer::Print(printer,"value :$name$, $number$\n","name",value1,"number",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar3 = lVar3 + 0x28;
    uVar1 = extraout_RDX_00;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"end\n");
  return;
}

Assistant:

void GenerateEnum(const google::protobuf::EnumDescriptor* en,
                  google::protobuf::io::Printer* printer) {
  printer->Print(
    "add_enum \"$name$\" do\n",
    "name", en->full_name());
  printer->Indent();

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer->Print(
      "value :$name$, $number$\n",
      "name", value->name(),
      "number", IntToString(value->number()));
  }

  printer->Outdent();
  printer->Print(
    "end\n");
}